

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O2

void libtorrent::aux::escape_string(string *ret,char *str,int len)

{
  long lVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  char tmp [3];
  
  lVar2 = (long)len;
  lVar5 = 0;
  lVar1 = 0;
  for (lVar3 = lVar2 >> 2; 0 < lVar3; lVar3 = lVar3 + -1) {
    if ((byte)(str[lVar5 * 4] + 0x81U) < 0xa1) {
      pcVar4 = str + -lVar1;
      goto LAB_0018266d;
    }
    if ((byte)(str[lVar5 * 4 + 1] + 0x81U) < 0xa1) {
      pcVar4 = str + (1 - lVar1);
      goto LAB_0018266d;
    }
    if ((byte)(str[lVar5 * 4 + 2] + 0x81U) < 0xa1) {
      pcVar4 = str + (2 - lVar1);
      goto LAB_0018266d;
    }
    if ((byte)(str[lVar5 * 4 + 3] + 0x81U) < 0xa1) {
      pcVar4 = str + (3 - lVar1);
      goto LAB_0018266d;
    }
    lVar1 = lVar1 + -4;
    lVar5 = lVar5 + 1;
  }
  pcVar4 = str + -lVar1;
  lVar3 = lVar2 + lVar1;
  if (lVar3 == 1) {
LAB_001826f0:
    if (0xa0 < (byte)(*pcVar4 + 0x81U)) goto LAB_001826fe;
  }
  else if (lVar3 == 3) {
    if (0xa0 < (byte)(str[lVar5 * 4] + 0x81U)) {
      pcVar4 = str + (1 - lVar1);
      goto LAB_001826e3;
    }
  }
  else {
    if (lVar3 != 2) goto LAB_001826fe;
LAB_001826e3:
    if (0xa0 < (byte)(*pcVar4 + 0x81U)) {
      pcVar4 = pcVar4 + 1;
      goto LAB_001826f0;
    }
  }
LAB_0018266d:
  if (pcVar4 != str + lVar2) {
    if (len < 1) {
      len = 0;
    }
    for (uVar6 = 0; (uint)len != uVar6; uVar6 = uVar6 + 1) {
      snprintf(tmp,3,"%02x",(ulong)(byte)str[uVar6]);
      ::std::__cxx11::string::append((char *)ret);
    }
    return;
  }
LAB_001826fe:
  ::std::__cxx11::string::assign((char *)ret,(ulong)str);
  return;
}

Assistant:

void escape_string(std::string& ret, char const* str, int len)
	{
		if (std::any_of(str, str + len, [](char const c) { return c < 32 || c >= 127; } ))
		{
			for (int i = 0; i < len; ++i)
			{
				char tmp[3];
				std::snprintf(tmp, sizeof(tmp), "%02x", std::uint8_t(str[i]));
				ret += tmp;
			}
		}
		else
		{
			ret.assign(str, std::size_t(len));
		}
	}